

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blk_sse_sum_sse2.c
# Opt level: O2

void sse_sum_wd8_sse2(int16_t *data,int stride,int bh,int *x_sum,int64_t *x2_sum,int loop_cycles)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 (*pauVar4) [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  uVar2 = 0;
  if (bh < 1) {
    bh = 0;
  }
  uVar3 = (ulong)(uint)loop_cycles;
  if (loop_cycles < 1) {
    uVar3 = uVar2;
  }
  iVar7 = 0;
  iVar8 = 0;
  iVar9 = 0;
  iVar10 = 0;
  auVar5 = (undefined1  [16])0x0;
  for (; pauVar4 = (undefined1 (*) [16])data, iVar1 = bh, uVar2 != uVar3; uVar2 = uVar2 + 1) {
    while (iVar1 != 0) {
      auVar6 = *pauVar4;
      auVar12 = pmaddwd(auVar6,_DAT_004651e0);
      auVar11 = pmaddwd(auVar6,auVar6);
      iVar7 = iVar7 + auVar12._0_4_;
      iVar8 = iVar8 + auVar12._4_4_;
      iVar9 = iVar9 + auVar12._8_4_;
      iVar10 = iVar10 + auVar12._12_4_;
      auVar6._0_4_ = auVar5._0_4_ + auVar11._0_4_;
      auVar6._4_4_ = auVar5._4_4_ + auVar11._4_4_;
      auVar6._8_4_ = auVar5._8_4_ + auVar11._8_4_;
      auVar6._12_4_ = auVar5._12_4_ + auVar11._12_4_;
      pauVar4 = (undefined1 (*) [16])(*pauVar4 + (long)stride * 2);
      auVar5 = auVar6;
      iVar1 = iVar1 + -1;
    }
    data = (int16_t *)((long)data + 0x10);
  }
  *x_sum = *x_sum + iVar10 + iVar8 + iVar9 + iVar7;
  *x2_sum = *x2_sum + (ulong)auVar5._12_4_ + (ulong)auVar5._4_4_ +
                      (ulong)auVar5._8_4_ + (auVar5._0_8_ & 0xffffffff);
  return;
}

Assistant:

static inline void sse_sum_wd8_sse2(const int16_t *data, int stride, int bh,
                                    int *x_sum, int64_t *x2_sum,
                                    int loop_cycles) {
  const int16_t *data_tmp;
  __m128i temp_buffer1, temp_buffer2;
  __m128i one = _mm_set1_epi16(1);
  __m128i regx_sum = _mm_setzero_si128();
  __m128i regx2_sum = regx_sum;
  __m128i load_pixels, sum_buffer, sse_buffer;

  for (int i = 0; i < loop_cycles; ++i) {
    data_tmp = data + (8 * i);
    for (int j = 0; j < bh; ++j) {
      // Load 1 row (8-pixels) at a time.
      load_pixels = _mm_loadu_si128((__m128i const *)(data_tmp));
      sum_buffer = _mm_madd_epi16(load_pixels, one);
      sse_buffer = _mm_madd_epi16(load_pixels, load_pixels);
      regx_sum = _mm_add_epi32(sum_buffer, regx_sum);
      regx2_sum = _mm_add_epi32(sse_buffer, regx2_sum);
      data_tmp += stride;
    }
  }

  regx_sum = _mm_add_epi32(regx_sum, _mm_srli_si128(regx_sum, 8));
  regx_sum = _mm_add_epi32(regx_sum, _mm_srli_si128(regx_sum, 4));
  *x_sum += _mm_cvtsi128_si32(regx_sum);
  temp_buffer1 = _mm_unpacklo_epi32(regx2_sum, _mm_setzero_si128());
  temp_buffer2 = _mm_unpackhi_epi32(regx2_sum, _mm_setzero_si128());
  regx2_sum = _mm_add_epi64(temp_buffer1, temp_buffer2);
  regx2_sum = _mm_add_epi64(regx2_sum, _mm_srli_si128(regx2_sum, 8));
#if AOM_ARCH_X86_64
  *x2_sum += _mm_cvtsi128_si64(regx2_sum);
#else
  {
    int64_t tmp;
    _mm_storel_epi64((__m128i *)&tmp, regx2_sum);
    *x2_sum += tmp;
  }
#endif
}